

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O0

void __thiscall
MeCab::FreeList<MeCab::NBestGenerator::QueueElement>::~FreeList
          (FreeList<MeCab::NBestGenerator::QueueElement> *this)

{
  pointer ppQVar1;
  pointer ppQVar2;
  reference ppQVar3;
  vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
  *in_RDI;
  
  (in_RDI->
  super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__FreeList_001c64d8;
  in_RDI[1].
  super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    ppQVar1 = in_RDI[1].
              super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    ppQVar2 = (pointer)std::
                       vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
                       ::size((vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
                               *)&(in_RDI->
                                  super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
                                  )._M_impl.super__Vector_impl_data._M_finish);
    if (ppQVar2 <= ppQVar1) break;
    ppQVar3 = std::
              vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
              ::operator[]((vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
                            *)&(in_RDI->
                               super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
                               )._M_impl.super__Vector_impl_data._M_finish,
                           (size_type)
                           in_RDI[1].
                           super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (*ppQVar3 != (value_type)0x0) {
      operator_delete__(*ppQVar3);
    }
    in_RDI[1].
    super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)in_RDI[1].
                         super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  std::
  vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
  ::~vector(in_RDI);
  return;
}

Assistant:

virtual ~FreeList() {
    for (li_ = 0; li_ < freeList.size(); li_++)
      delete [] freeList[li_];
  }